

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::RecyclerParallelThread::StartConcurrent(RecyclerParallelThread *this)

{
  undefined4 *puVar1;
  ThreadService *pTVar2;
  code *pcVar3;
  bool bVar4;
  char cVar5;
  HANDLE pVVar6;
  undefined8 *in_FS_OFFSET;
  
  if (*(long *)this->recycler->threadService == 0) {
    if (this->concurrentWorkDoneEvent == (HANDLE)0x0) {
      bVar4 = EnableConcurrent(this,false);
      return bVar4;
    }
    if (this->concurrentThread == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1acb,"(this->concurrentThread != 0)","this->concurrentThread != NULL");
      if (!bVar4) goto LAB_0028a3a6;
      *puVar1 = 0;
    }
    pVVar6 = this->concurrentWorkReadyEvent;
    if (pVVar6 == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1acc,"(this->concurrentWorkReadyEvent != 0)",
                         "this->concurrentWorkReadyEvent != NULL");
      if (!bVar4) goto LAB_0028a3a6;
      *puVar1 = 0;
      pVVar6 = this->concurrentWorkReadyEvent;
    }
    SetEvent(pVVar6);
  }
  else {
    if (this->concurrentWorkDoneEvent == (HANDLE)0x0) {
      pVVar6 = CreateEventW((LPSECURITY_ATTRIBUTES)0x0,0,0,(LPCWSTR)0x0);
      this->concurrentWorkDoneEvent = pVVar6;
      if (pVVar6 == (HANDLE)0x0) {
        return false;
      }
    }
    if (this->concurrentThread != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1ab9,"(concurrentThread == 0)","concurrentThread == NULL");
      if (!bVar4) goto LAB_0028a3a6;
      *puVar1 = 0;
    }
    if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1aba,"(concurrentWorkReadyEvent == 0)",
                         "concurrentWorkReadyEvent == NULL");
      if (!bVar4) {
LAB_0028a3a6:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    pTVar2 = this->recycler->threadService;
    pTVar2[8] = (ThreadService)0x1;
    cVar5 = (**(code **)pTVar2)(StaticBackgroundWorkCallback,this);
    pTVar2[8] = (ThreadService)0x0;
    if (cVar5 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool
RecyclerParallelThread::StartConcurrent()
{
    if (this->recycler->threadService->HasCallback())
    {
        // This may be the first time.  If so, initialize by creating the doneEvent.
        if (this->concurrentWorkDoneEvent == NULL)
        {
            this->concurrentWorkDoneEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
            if (this->concurrentWorkDoneEvent == nullptr)
            {
                return false;
            }
        }

        Assert(concurrentThread == NULL);
        Assert(concurrentWorkReadyEvent == NULL);

        // Invoke thread service to process work
        if (!this->recycler->threadService->Invoke(RecyclerParallelThread::StaticBackgroundWorkCallback, this))
        {
            return false;
        }
    }
    else
    {
        // This may be the first time.  If so, initialize and create thread.
        if (this->concurrentWorkDoneEvent == NULL)
        {
            return this->EnableConcurrent(false);
        }
        else
        {
            Assert(this->concurrentThread != NULL);
            Assert(this->concurrentWorkReadyEvent != NULL);

            // signal that thread has been initialized
            SetEvent(this->concurrentWorkReadyEvent);
        }
    }
    return true;
}